

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedWriteTessellation::Setup(AdvancedWriteTessellation *this)

{
  this->m_program = 0;
  this->m_storage_buffer = 0;
  this->m_counter_buffer = 0;
  this->m_vertex_array = 0;
  this->m_vertex_buffer = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program		 = 0;
		m_storage_buffer = 0;
		m_counter_buffer = 0;
		m_vertex_array   = 0;
		m_vertex_buffer  = 0;
		return NO_ERROR;
	}